

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::IStreamingReporter> __thiscall
Catch::addReporter(Catch *this,Ptr<Catch::IStreamingReporter> *existingReporter,
                  Ptr<Catch::IStreamingReporter> *additionalReporter)

{
  type tVar1;
  IStreamingReporter *pIVar2;
  MultipleReporters *this_00;
  MultipleReporters *local_70;
  Ptr<Catch::IStreamingReporter> local_48;
  MultipleReporters *local_40;
  MultipleReporters *multi;
  undefined1 local_21;
  Ptr<Catch::IStreamingReporter> *local_20;
  Ptr<Catch::IStreamingReporter> *additionalReporter_local;
  Ptr<Catch::IStreamingReporter> *existingReporter_local;
  Ptr<Catch::IStreamingReporter> *resultingReporter;
  
  local_21 = 0;
  local_20 = additionalReporter;
  additionalReporter_local = existingReporter;
  existingReporter_local = (Ptr<Catch::IStreamingReporter> *)this;
  Ptr<Catch::IStreamingReporter>::Ptr((Ptr<Catch::IStreamingReporter> *)this);
  tVar1 = Ptr::operator_cast_to_function_pointer((Ptr *)additionalReporter_local);
  if (tVar1 == 0) {
    Ptr<Catch::IStreamingReporter>::operator=((Ptr<Catch::IStreamingReporter> *)this,local_20);
  }
  else {
    pIVar2 = Ptr<Catch::IStreamingReporter>::get(additionalReporter_local);
    if (pIVar2 == (IStreamingReporter *)0x0) {
      local_70 = (MultipleReporters *)0x0;
    }
    else {
      local_70 = (MultipleReporters *)
                 __dynamic_cast(pIVar2,&IStreamingReporter::typeinfo,&MultipleReporters::typeinfo,0)
      ;
    }
    local_40 = local_70;
    if (local_70 == (MultipleReporters *)0x0) {
      this_00 = (MultipleReporters *)operator_new(0x28);
      MultipleReporters::MultipleReporters(this_00);
      local_40 = this_00;
      Ptr<Catch::IStreamingReporter>::Ptr(&local_48,(IStreamingReporter *)this_00);
      Ptr<Catch::IStreamingReporter>::operator=((Ptr<Catch::IStreamingReporter> *)this,&local_48);
      Ptr<Catch::IStreamingReporter>::~Ptr(&local_48);
      tVar1 = Ptr::operator_cast_to_function_pointer((Ptr *)additionalReporter_local);
      if (tVar1 != 0) {
        MultipleReporters::add(local_40,additionalReporter_local);
      }
    }
    else {
      Ptr<Catch::IStreamingReporter>::operator=
                ((Ptr<Catch::IStreamingReporter> *)this,additionalReporter_local);
    }
    MultipleReporters::add(local_40,local_20);
  }
  return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)this;
}

Assistant:

Ptr<IStreamingReporter> addReporter( Ptr<IStreamingReporter> const& existingReporter, Ptr<IStreamingReporter> const& additionalReporter ) {
    Ptr<IStreamingReporter> resultingReporter;

    if( existingReporter ) {
        MultipleReporters* multi = dynamic_cast<MultipleReporters*>( existingReporter.get() );
        if( !multi ) {
            multi = new MultipleReporters;
            resultingReporter = Ptr<IStreamingReporter>( multi );
            if( existingReporter )
                multi->add( existingReporter );
        }
        else
            resultingReporter = existingReporter;
        multi->add( additionalReporter );
    }
    else
        resultingReporter = additionalReporter;

    return resultingReporter;
}